

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_swap.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Base_swap<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true>_>_>_>
::Base_swap(Base_swap<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true>_>_>_>
            *this,uint numberOfColumns)

{
  key_type kVar1;
  key_type kVar2;
  ulong __n;
  mapped_type *pmVar3;
  key_type local_2c;
  allocator<std::pair<const_unsigned_int,_unsigned_int>_> local_27;
  key_equal local_26;
  hasher local_25;
  Index i;
  allocator<std::pair<const_unsigned_int,_unsigned_int>_> local_17;
  key_equal local_16;
  hasher local_15;
  uint local_14;
  Base_swap<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true>_>_>_>
  *pBStack_10;
  uint numberOfColumns_local;
  Base_swap<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true>_>_>_>
  *this_local;
  
  local_14 = numberOfColumns;
  pBStack_10 = this;
  std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>::allocator(&local_17);
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::unordered_map(&this->indexToRow_,(ulong)numberOfColumns,&local_15,&local_16,&local_17);
  std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>::~allocator(&local_17);
  __n = (ulong)local_14;
  std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>::allocator(&local_27);
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::unordered_map(&this->rowToIndex_,__n,&local_25,&local_26,&local_27);
  std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>::~allocator(&local_27);
  this->rowSwapped_ = false;
  for (local_2c = 0; kVar1 = local_2c, local_2c < local_14; local_2c = local_2c + 1) {
    pmVar3 = std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&this->indexToRow_,&local_2c);
    kVar2 = local_2c;
    *pmVar3 = kVar1;
    pmVar3 = std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&this->rowToIndex_,&local_2c);
    *pmVar3 = kVar2;
  }
  return;
}

Assistant:

inline Base_swap<Master_matrix, Base_matrix>::Base_swap(unsigned int numberOfColumns)
    : indexToRow_(numberOfColumns), rowToIndex_(numberOfColumns), rowSwapped_(false)
{
  for (Index i = 0; i < numberOfColumns; i++) {
    indexToRow_[i] = i;
    rowToIndex_[i] = i;
  }
}